

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O1

void Prs_CreateBlifPio(Cba_Ntk_t *p,Prs_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  Cba_Man_t *pCVar3;
  uint i;
  int i_00;
  int *piVar4;
  int Fill;
  int Fill_00;
  long lVar5;
  ulong uVar6;
  
  uVar1 = (p->vObjType).nCap;
  if ((p->vObjFunc).nCap < (int)uVar1) {
    piVar4 = (p->vObjFunc).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (p->vObjFunc).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_0033d587;
    (p->vObjFunc).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vObjFunc).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vObjFunc).nSize = uVar1;
  uVar1 = (p->vObjType).nCap;
  if ((p->vObjName).nCap < (int)uVar1) {
    piVar4 = (p->vObjName).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (p->vObjName).pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_0033d587;
    (p->vObjName).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vObjName).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vObjName).nSize = uVar1;
  uVar1 = (p->vFonObj).nCap;
  if ((p->vFonName).nCap < (int)uVar1) {
    piVar4 = (p->vFonName).pArray;
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar4 = (int *)realloc(piVar4,(long)(int)uVar1 << 2);
    }
    (p->vFonName).pArray = piVar4;
    if (piVar4 == (int *)0x0) {
LAB_0033d587:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vFonName).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vFonName).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vFonName).nSize = uVar1;
  if (0 < (pNtk->vInputs).nSize) {
    lVar5 = 0;
    do {
      if ((pNtk->vInputs).nSize <= lVar5) goto LAB_0033d50b;
      uVar1 = (pNtk->vInputs).pArray[lVar5];
      uVar6 = (ulong)uVar1;
      if (uVar6 == 0) break;
      i = Cba_ObjAlloc(p,CBA_OBJ_PI,0,1);
      Cba_ObjSetName(p,i,uVar1);
      if ((int)i < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x155,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if ((p->vObjFon0).nSize <= (int)i) goto LAB_0033d50b;
      iVar2 = (p->vObjFon0).pArray[i];
      Cba_FonSetName(p,iVar2,uVar1);
      pCVar3 = p->pDesign;
      Vec_IntFillExtra(&pCVar3->vNameMap,uVar1 + 1,Fill);
      if (((int)uVar1 < 0) || ((pCVar3->vNameMap).nSize <= (int)uVar1)) goto LAB_0033d50b;
      if ((pCVar3->vNameMap).pArray[uVar6] != 0) {
        __assert_fail("Vec_IntGetEntry(&p->vNameMap, i) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x37b,"void Cba_ManSetMap(Cba_Man_t *, int, int)");
      }
      Vec_IntFillExtra(&pCVar3->vNameMap,uVar1 + 1,Fill_00);
      if ((pCVar3->vNameMap).nSize <= (int)uVar1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pCVar3->vNameMap).pArray[uVar6] = iVar2;
      Vec_IntPush(&pCVar3->vUsed,uVar1);
      Vec_IntPush(&p->vOrder,i);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pNtk->vInputs).nSize);
  }
  if (0 < (pNtk->vOutputs).nSize) {
    lVar5 = 0;
    do {
      if ((pNtk->vOutputs).nSize <= lVar5) {
LAB_0033d50b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (pNtk->vOutputs).pArray[lVar5];
      if (iVar2 == 0) {
        return;
      }
      i_00 = Cba_ObjAlloc(p,CBA_OBJ_PO,1,0);
      Cba_ObjSetName(p,i_00,iVar2);
      Vec_IntPush(&p->vOrder,i_00);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pNtk->vOutputs).nSize);
  }
  return;
}

Assistant:

void Prs_CreateBlifPio( Cba_Ntk_t * p, Prs_Ntk_t * pNtk )
{
    int i, NameId, iObj, iFon;
    Cba_NtkCleanObjFuncs( p );
    Cba_NtkCleanObjNames( p );
    Cba_NtkCleanFonNames( p );
    // create inputs
    Prs_NtkForEachPi( pNtk, NameId, i )
    {
        iObj = Cba_ObjAlloc( p, CBA_OBJ_PI, 0, 1 );
        Cba_ObjSetName( p, iObj, NameId );
        iFon = Cba_ObjFon0(p, iObj);
        Cba_FonSetName( p, iFon, NameId );
        Cba_NtkSetMap( p, NameId, iFon );
        Vec_IntPush( &p->vOrder, iObj );
    }
    // create outputs
    Prs_NtkForEachPo( pNtk, NameId, i )
    {
        iObj = Cba_ObjAlloc( p, CBA_OBJ_PO, 1, 0 );
        Cba_ObjSetName( p, iObj, NameId );
        Vec_IntPush( &p->vOrder, iObj );
    }
}